

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

Result __thiscall
testing::internal::
FunctionMocker<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()>::Invoke
          (FunctionMocker<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()>
           *this)

{
  UntypedActionResultHolderBase *f;
  ActionResultHolder<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&> *__p;
  pointer this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar1;
  unique_ptr<testing::internal::ActionResultHolder<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>,_std::default_delete<testing::internal::ActionResultHolder<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>_>_>
  local_20;
  unique_ptr<testing::internal::ActionResultHolder<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>,_std::default_delete<testing::internal::ActionResultHolder<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>_>_>
  holder;
  ArgumentTuple tuple;
  FunctionMocker<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&()> *this_local;
  
  holder._M_t.
  super___uniq_ptr_impl<testing::internal::ActionResultHolder<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>,_std::default_delete<testing::internal::ActionResultHolder<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::ActionResultHolder<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>_*,_std::default_delete<testing::internal::ActionResultHolder<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>_>_>
  .
  super__Head_base<0UL,_testing::internal::ActionResultHolder<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>_*,_false>
  ._M_head_impl._7_1_ = 0;
  f = UntypedFunctionMockerBase::UntypedInvokeWith
                (&this->super_UntypedFunctionMockerBase,
                 (void *)((long)&holder._M_t.
                                 super___uniq_ptr_impl<testing::internal::ActionResultHolder<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>,_std::default_delete<testing::internal::ActionResultHolder<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_testing::internal::ActionResultHolder<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>_*,_std::default_delete<testing::internal::ActionResultHolder<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>_>_>
                                 .
                                 super__Head_base<0UL,_testing::internal::ActionResultHolder<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>_*,_false>
                                 ._M_head_impl + 7));
  __p = DownCast_<testing::internal::ActionResultHolder<std::vector<unsigned_char,std::allocator<unsigned_char>>const&>*,testing::internal::UntypedActionResultHolderBase>
                  (f);
  std::
  unique_ptr<testing::internal::ActionResultHolder<std::vector<unsigned_char,std::allocator<unsigned_char>>const&>,std::default_delete<testing::internal::ActionResultHolder<std::vector<unsigned_char,std::allocator<unsigned_char>>const&>>>
  ::
  unique_ptr<std::default_delete<testing::internal::ActionResultHolder<std::vector<unsigned_char,std::allocator<unsigned_char>>const&>>,void>
            ((unique_ptr<testing::internal::ActionResultHolder<std::vector<unsigned_char,std::allocator<unsigned_char>>const&>,std::default_delete<testing::internal::ActionResultHolder<std::vector<unsigned_char,std::allocator<unsigned_char>>const&>>>
              *)&local_20,__p);
  this_00 = std::
            unique_ptr<testing::internal::ActionResultHolder<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>,_std::default_delete<testing::internal::ActionResultHolder<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>_>_>
            ::operator->(&local_20);
  pvVar1 = ActionResultHolder<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>::
           Unwrap(this_00);
  std::
  unique_ptr<testing::internal::ActionResultHolder<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>,_std::default_delete<testing::internal::ActionResultHolder<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&>_>_>
  ::~unique_ptr(&local_20);
  return pvVar1;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    ArgumentTuple tuple(std::forward<Args>(args)...);
    std::unique_ptr<ResultHolder> holder(DownCast_<ResultHolder*>(
        this->UntypedInvokeWith(static_cast<void*>(&tuple))));
    return holder->Unwrap();
  }